

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::PostDepthSampleMaskCase::PostDepthSampleMaskCase
          (PostDepthSampleMaskCase *this,Context *context)

{
  Context *context_local;
  PostDepthSampleMaskCase *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"PostDepthSampleMask",
             "Verifies multisampling with depth test and stencil test functionality added in ARB_post_depth_coverage extension"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PostDepthSampleMaskCase_0323d938;
  this->m_framebufferMS = 0;
  this->m_framebuffer = 0;
  this->m_textureMS = 0;
  this->m_texture = 0;
  this->m_depthStencilRenderbuffer = 0;
  std::__cxx11::string::string((string *)&this->m_vertShader);
  std::__cxx11::string::string((string *)&this->m_fragShader1a);
  std::__cxx11::string::string((string *)&this->m_fragShader1b);
  std::__cxx11::string::string((string *)&this->m_fragShader2);
  return;
}

Assistant:

PostDepthSampleMaskCase::PostDepthSampleMaskCase(deqp::Context& context)
	: TestCase(context, "PostDepthSampleMask", "Verifies multisampling with depth test and stencil test functionality "
											   "added in ARB_post_depth_coverage extension")
	, m_framebufferMS(0)
	, m_framebuffer(0)
	, m_textureMS(0)
	, m_texture(0)
	, m_depthStencilRenderbuffer(0)
{
	/* Left blank intentionally */
}